

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test *this_00;
  TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0x10a);
  TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test::
  TEST_MemoryLeakDetectorTest_DeleteNonAlocatedMemory_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, DeleteNonAlocatedMemory)
{
    char a;
    char* pa = &a;
    detector->deallocMemory(defaultMallocAllocator(), pa, "FREE.c", 100);
    detector->stopChecking();
    CHECK(reporter->message->contains("Deallocating non-allocated memory"));
    CHECK(reporter->message->contains("   allocated at file: <unknown> line: 0 size: 0 type: unknown"));
    CHECK(reporter->message->contains("   deallocated at file: FREE.c line: 100 type: free"));
}